

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O0

mpt_output * localPassOutput(mpt_local_output *lo)

{
  int iVar1;
  mpt_local_output *local_28;
  mpt_output *out;
  mpt_metatype *mt;
  mpt_local_output *lo_local;
  
  local_28 = (mpt_local_output *)0x0;
  out = (mpt_output *)lo->pass;
  if (((mpt_metatype *)out != (mpt_metatype *)0x0) &&
     (mt = &lo->_mt,
     iVar1 = (*(((mpt_metatype *)out)->_vptr->convertable).convert)
                       ((mpt_convertable *)out,0x83,&local_28), -1 < iVar1)) {
    return (mpt_output *)local_28;
  }
  return (mpt_output *)0x0;
}

Assistant:

inline static MPT_INTERFACE(output) *localPassOutput(const MPT_STRUCT(local_output) *lo)
{
	MPT_INTERFACE(metatype) *mt;
	MPT_INTERFACE(output) *out;
	out = 0;
	if (!(mt = lo->pass)
	    || MPT_metatype_convert(mt, MPT_ENUM(TypeOutputPtr), &out) < 0) {
		return 0;
	}
	return out;
}